

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# format.h
# Opt level: O0

void fmt::v10::detail::vformat_to<char>
               (buffer<char> *buf,basic_string_view<char> fmt,type args,locale_ref loc)

{
  undefined1 value [16];
  undefined1 value_00 [16];
  undefined1 value_01 [16];
  undefined1 value_02 [16];
  basic_format_args<fmt::v10::basic_format_context<fmt::v10::appender,_char>_> p_args;
  basic_string_view<char> str;
  custom_value<fmt::v10::basic_format_context<fmt::v10::appender,_char>_> custom;
  bool bVar1;
  size_t sVar2;
  char *pcVar3;
  char *last;
  undefined8 in_stack_fffffffffffffdb8;
  undefined2 in_stack_fffffffffffffdc0;
  undefined6 in_stack_fffffffffffffdc2;
  format_handler local_1c8;
  anon_union_8_2_de49483c_for_basic_format_args<fmt::v10::basic_format_context<fmt::v10::appender,_char>_>_2
  local_190;
  char *local_188;
  default_arg_formatter<char> local_178;
  undefined1 auStack_158 [8];
  format_arg arg;
  buffer_appender<char> out;
  buffer<char> *buf_local;
  locale_ref loc_local;
  type args_local;
  basic_string_view<char> fmt_local;
  custom_value<fmt::v10::basic_format_context<fmt::v10::appender,_char>_> local_e8;
  basic_string_view<char> local_d8;
  unsigned___int128 *local_c8;
  unsigned___int128 *local_b8;
  __int128 *local_98;
  __int128 *local_88;
  undefined1 *local_68;
  default_arg_formatter<char> *local_60;
  char *local_50;
  char *p_1;
  writer write;
  char *pcStack_38;
  char c;
  char *p;
  char *end;
  char *begin;
  anon_union_8_2_de49483c_for_basic_format_args<fmt::v10::basic_format_context<fmt::v10::appender,_char>_>_2
  local_18;
  char *local_10;
  
  args_local.desc_ = (unsigned_long_long)args.field_1;
  loc_local.locale_ = (void *)args.desc_;
  fmt_local.data_ = (char *)fmt.size_;
  args_local.field_1 =
       (anon_union_8_2_de49483c_for_basic_format_args<fmt::v10::basic_format_context<fmt::v10::appender,_char>_>_2
        )fmt.data_;
  appender::back_insert_iterator((appender *)&arg.field_0x18,buf);
  sVar2 = basic_string_view<char>::size((basic_string_view<char> *)&args_local.field_1);
  if (sVar2 == 2) {
    pcVar3 = basic_string_view<char>::data((basic_string_view<char> *)&args_local.field_1);
    bVar1 = equal2(pcVar3,"{}");
    if (bVar1) {
      basic_format_args<fmt::v10::basic_format_context<fmt::v10::appender,_char>_>::get
                ((format_arg *)auStack_158,
                 (basic_format_args<fmt::v10::basic_format_context<fmt::v10::appender,_char>_> *)
                 &loc_local,0);
      bVar1 = basic_format_arg::operator_cast_to_bool((basic_format_arg *)auStack_158);
      if (bVar1) {
        local_178.out.super_back_insert_iterator<fmt::v10::detail::buffer<char>_>.container =
             (back_insert_iterator<fmt::v10::detail::buffer<char>_>)
             (back_insert_iterator<fmt::v10::detail::buffer<char>_>)arg._24_8_;
        local_178.args.desc_ = (unsigned_long_long)loc_local.locale_;
        local_178.args.field_1 =
             (anon_union_8_2_de49483c_for_basic_format_args<fmt::v10::basic_format_context<fmt::v10::appender,_char>_>_2
              )args_local.desc_;
        local_68 = auStack_158;
        local_178.loc.locale_ = loc.locale_;
        local_60 = &local_178;
        switch(arg.value_.field_0.int128_value._8_4_) {
        case 0:
          break;
        case 1:
          default_arg_formatter<char>::operator()(&local_178,auStack_158._0_4_);
          return;
        case 2:
          default_arg_formatter<char>::operator()(&local_178,auStack_158._0_4_);
          return;
        case 3:
          default_arg_formatter<char>::operator()
                    (&local_178,CONCAT44(auStack_158._4_4_,auStack_158._0_4_));
          return;
        case 4:
          default_arg_formatter<char>::operator()
                    (&local_178,CONCAT44(auStack_158._4_4_,auStack_158._0_4_));
          return;
        case 5:
          value._8_2_ = in_stack_fffffffffffffdc0;
          value._0_8_ = in_stack_fffffffffffffdb8;
          value._10_6_ = in_stack_fffffffffffffdc2;
          local_98 = convert_for_visit<__int128>
                               ((__int128 *)CONCAT44(auStack_158._4_4_,auStack_158._0_4_),
                                (__int128)value);
          value_00._8_2_ = in_stack_fffffffffffffdc0;
          value_00._0_8_ = in_stack_fffffffffffffdb8;
          value_00._10_6_ = in_stack_fffffffffffffdc2;
          local_88 = local_98;
          default_arg_formatter<char>::operator()(&local_178,(__int128)value_00);
          return;
        case 6:
          value_01._8_2_ = in_stack_fffffffffffffdc0;
          value_01._0_8_ = in_stack_fffffffffffffdb8;
          value_01._10_6_ = in_stack_fffffffffffffdc2;
          local_c8 = convert_for_visit<unsigned__int128>
                               ((unsigned___int128 *)CONCAT44(auStack_158._4_4_,auStack_158._0_4_),
                                (detail *)
                                CONCAT62(arg.value_.field_0.long_long_value._2_6_,
                                         arg.value_.field_0.int_value._0_2_),
                                (unsigned___int128)value_01);
          value_02._8_2_ = in_stack_fffffffffffffdc0;
          value_02._0_8_ = in_stack_fffffffffffffdb8;
          value_02._10_6_ = in_stack_fffffffffffffdc2;
          local_b8 = local_c8;
          default_arg_formatter<char>::operator()(&local_178,(unsigned___int128)value_02);
          return;
        case 7:
          default_arg_formatter<char>::operator()(&local_178,(bool)(auStack_158[0] & 1));
          return;
        case 8:
          default_arg_formatter<char>::operator()(&local_178,auStack_158[0]);
          return;
        case 9:
          default_arg_formatter<char>::operator()(&local_178,(float)auStack_158._0_4_);
          return;
        case 10:
          default_arg_formatter<char>::operator()
                    (&local_178,(double)CONCAT44(auStack_158._4_4_,auStack_158._0_4_));
          return;
        case 0xb:
          default_arg_formatter<char>::operator()
                    (&local_178,
                     (longdouble)
                     CONCAT28(arg.value_.field_0.int_value._0_2_,
                              CONCAT44(auStack_158._4_4_,auStack_158._0_4_)));
          return;
        case 0xc:
          default_arg_formatter<char>::operator()
                    (&local_178,(char *)CONCAT44(auStack_158._4_4_,auStack_158._0_4_));
          return;
        case 0xd:
          basic_string_view<char>::basic_string_view
                    (&local_d8,(char *)CONCAT44(auStack_158._4_4_,auStack_158._0_4_),
                     CONCAT62(arg.value_.field_0.long_long_value._2_6_,
                              arg.value_.field_0.int_value._0_2_));
          default_arg_formatter<char>::operator()(&local_178,local_d8);
          return;
        case 0xe:
          default_arg_formatter<char>::operator()
                    (&local_178,(void *)CONCAT44(auStack_158._4_4_,auStack_158._0_4_));
          return;
        case 0xf:
          custom.value._4_4_ = auStack_158._4_4_;
          custom.value._0_4_ = auStack_158._0_4_;
          custom.format._0_2_ = arg.value_.field_0.int_value._0_2_;
          custom.format._2_6_ = arg.value_.field_0.long_long_value._2_6_;
          basic_format_arg<fmt::v10::basic_format_context<fmt::v10::appender,_char>_>::handle::
          handle((handle *)&local_e8,custom);
          default_arg_formatter<char>::operator()(&local_178,(handle)local_e8);
          return;
        }
        monostate::monostate((monostate *)((long)&fmt_local.size_ + 7));
        default_arg_formatter<char>::operator()(&local_178);
        return;
      }
      throw_format_error("argument not found");
    }
  }
  local_190 = args_local.field_1;
  local_188 = fmt_local.data_;
  str.size_ = (size_t)fmt_local.data_;
  str.data_ = (char *)args_local.field_1.values_;
  p_args.field_1 =
       (anon_union_8_2_de49483c_for_basic_format_args<fmt::v10::basic_format_context<fmt::v10::appender,_char>_>_2
        )args_local.desc_;
  p_args.desc_ = (unsigned_long_long)loc_local.locale_;
  vformat_to<char>(fmt::v10::detail::buffer<char>&,fmt::v10::basic_string_view<char>,fmt::v10::
  detail::vformat_args<char>::type,fmt::v10::detail::locale_ref)::format_handler::format_handler(fmt
  ::v10::appender,fmt::v10::basic_string_view<char>,fmt::v10::basic_format_args<fmt::v10::
  basic_format_context<fmt::v10::appender,char>>,fmt::v10::detail::locale_ref_
            (&local_1c8,(buffer_appender<char>)arg._24_8_,str,p_args,loc);
  local_18 = local_190;
  local_10 = local_188;
  end = basic_string_view<char>::data((basic_string_view<char> *)&local_18);
  sVar2 = basic_string_view<char>::size((basic_string_view<char> *)&local_18);
  last = end + sVar2;
  p_1 = (char *)&local_1c8;
  pcVar3 = end;
  if ((long)last - (long)end < 0x20) {
    while (pcStack_38 = pcVar3, pcStack_38 != last) {
      pcVar3 = pcStack_38 + 1;
      write.handler_._7_1_ = *pcStack_38;
      if (write.handler_._7_1_ == '{') {
        vformat_to<char>::format_handler::on_text(&local_1c8,end,pcStack_38);
        end = parse_replacement_field<char,fmt::v10::detail::vformat_to<char>(fmt::v10::detail::buffer<char>&,fmt::v10::basic_string_view<char>,fmt::v10::detail::vformat_args<char>::type,fmt::v10::detail::locale_ref)::format_handler&>
                        (pcStack_38,last,&local_1c8);
        pcVar3 = end;
      }
      else if (write.handler_._7_1_ == '}') {
        if ((pcVar3 == last) || (*pcVar3 != '}')) {
          error_handler::on_error((error_handler *)&local_1c8,"unmatched \'}\' in format string");
        }
        vformat_to<char>::format_handler::on_text(&local_1c8,end,pcVar3);
        end = pcStack_38 + 2;
        pcVar3 = end;
      }
    }
    vformat_to<char>::format_handler::on_text(&local_1c8,end,last);
  }
  else {
    while (end != last) {
      local_50 = end;
      if ((*end != '{') &&
         (bVar1 = find<false,char,char_const*>(end + 1,last,'{',&local_50), !bVar1)) {
        parse_format_string<false,_char,_format_handler>::writer::operator()
                  ((writer *)&p_1,end,last);
        return;
      }
      parse_format_string<false,_char,_format_handler>::writer::operator()
                ((writer *)&p_1,end,local_50);
      end = parse_replacement_field<char,fmt::v10::detail::vformat_to<char>(fmt::v10::detail::buffer<char>&,fmt::v10::basic_string_view<char>,fmt::v10::detail::vformat_args<char>::type,fmt::v10::detail::locale_ref)::format_handler&>
                      (local_50,last,&local_1c8);
    }
  }
  return;
}

Assistant:

void vformat_to(buffer<Char>& buf, basic_string_view<Char> fmt,
                typename vformat_args<Char>::type args, locale_ref loc) {
  auto out = buffer_appender<Char>(buf);
  if (fmt.size() == 2 && equal2(fmt.data(), "{}")) {
    auto arg = args.get(0);
    if (!arg) throw_format_error("argument not found");
    visit_format_arg(default_arg_formatter<Char>{out, args, loc}, arg);
    return;
  }

  struct format_handler : error_handler {
    basic_format_parse_context<Char> parse_context;
    buffer_context<Char> context;

    format_handler(buffer_appender<Char> p_out, basic_string_view<Char> str,
                   basic_format_args<buffer_context<Char>> p_args,
                   locale_ref p_loc)
        : parse_context(str), context(p_out, p_args, p_loc) {}

    void on_text(const Char* begin, const Char* end) {
      auto text = basic_string_view<Char>(begin, to_unsigned(end - begin));
      context.advance_to(write<Char>(context.out(), text));
    }

    FMT_CONSTEXPR auto on_arg_id() -> int {
      return parse_context.next_arg_id();
    }
    FMT_CONSTEXPR auto on_arg_id(int id) -> int {
      return parse_context.check_arg_id(id), id;
    }
    FMT_CONSTEXPR auto on_arg_id(basic_string_view<Char> id) -> int {
      int arg_id = context.arg_id(id);
      if (arg_id < 0) throw_format_error("argument not found");
      return arg_id;
    }

    FMT_INLINE void on_replacement_field(int id, const Char*) {
      auto arg = get_arg(context, id);
      context.advance_to(visit_format_arg(
          default_arg_formatter<Char>{context.out(), context.args(),
                                      context.locale()},
          arg));
    }

    auto on_format_specs(int id, const Char* begin, const Char* end)
        -> const Char* {
      auto arg = get_arg(context, id);
      // Not using a visitor for custom types gives better codegen.
      if (arg.format_custom(begin, parse_context, context))
        return parse_context.begin();
      auto specs = detail::dynamic_format_specs<Char>();
      begin = parse_format_specs(begin, end, specs, parse_context, arg.type());
      detail::handle_dynamic_spec<detail::width_checker>(
          specs.width, specs.width_ref, context);
      detail::handle_dynamic_spec<detail::precision_checker>(
          specs.precision, specs.precision_ref, context);
      if (begin == end || *begin != '}')
        throw_format_error("missing '}' in format string");
      auto f = arg_formatter<Char>{context.out(), specs, context.locale()};
      context.advance_to(visit_format_arg(f, arg));
      return begin;
    }
  };
  detail::parse_format_string<false>(fmt, format_handler(out, fmt, args, loc));
}